

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::FboCases::ColorClearsTest::render
          (ColorClearsTest *this,Context *context,Surface *dst)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  float fVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Vec4 VVar10;
  Vec3 local_1e4;
  Framebuffer fbo;
  deRandom rnd;
  undefined1 *local_194;
  float local_18c;
  Vec4 color;
  
  deRandom_init(&rnd,0);
  Framebuffer::Framebuffer(&fbo,context,&(this->super_FboRenderCase).m_config,0x80,0x80,0,0,0,0);
  Framebuffer::checkCompleteness(&fbo);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fbo.m_framebuffer);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  (*context->_vptr_Context[0x33])(context,0xc11);
  iVar9 = 0xf;
  do {
    dVar1 = deRandom_getUint32(&rnd);
    dVar2 = deRandom_getUint32(&rnd);
    dVar3 = deRandom_getUint32(&rnd);
    dVar4 = deRandom_getUint32(&rnd);
    fVar5 = (float)deRandom_getUint32(&rnd);
    local_1e4.m_data[0] = fVar5;
    VVar10 = tcu::RGBA::toVec((RGBA *)&color);
    (*context->_vptr_Context[0x32])
              (VVar10.m_data._0_8_,VVar10.m_data._8_8_,context,(ulong)(dVar1 & 0x7f),
               (ulong)(dVar2 & 0x7f),(ulong)(dVar3 & 0x7fffffff) % (ulong)(0x80 - (dVar1 & 0x7f)),
               (ulong)(dVar4 & 0x7fffffff) % (ulong)(0x80 - (dVar2 & 0x7f)));
    (*context->_vptr_Context[0x2a])
              ((ulong)(uint)color.m_data[0],(ulong)(uint)color.m_data[1],color.m_data[2],
               color.m_data[3],context);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  (*context->_vptr_Context[0x34])(context,0xc11);
  if (fbo.m_config.colorbufferType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    SingleTex2DShader::SingleTex2DShader((SingleTex2DShader *)&color);
    uVar6 = (*context->_vptr_Context[0x75])(context,&color);
    (*context->_vptr_Context[0x76])(context,(ulong)uVar6);
    uVar7 = (*context->_vptr_Context[0x66])(context,(ulong)uVar6,"u_sampler0");
    (*context->_vptr_Context[0x5b])(context,(ulong)uVar7,0);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fbo.m_colorbuffer);
    uVar7 = (*context->_vptr_Context[2])(context);
    uVar8 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar7,(ulong)uVar8);
    local_1e4.m_data[0] = -1.0;
    local_1e4.m_data[1] = -1.0;
    local_1e4.m_data[2] = 0.0;
    local_194 = &DAT_3f8000003f800000;
    local_18c = 0.0;
    sglr::drawQuad(context,uVar6,&local_1e4,(Vec3 *)&local_194);
    uVar6 = (*context->_vptr_Context[2])(context);
    uVar7 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uVar6,(ulong)uVar7);
    sglr::ShaderProgram::~ShaderProgram((ShaderProgram *)&color);
  }
  else {
    (*context->_vptr_Context[0x80])(context,dst,0,0,0x80,0x80);
  }
  Framebuffer::~Framebuffer(&fbo);
  return;
}

Assistant:

void ColorClearsTest::render (sglr::Context& context, Surface& dst)
{
	int			width	= 128;
	int			height	= 128;
	deRandom	rnd;

	deRandom_init(&rnd, 0);

	// Create framebuffer
	Framebuffer fbo(context, getConfig(), width, height);
	fbo.checkCompleteness();

	// Clear fbo
	context.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	context.viewport(0, 0, width, height);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Enable scissor test.
	context.enable(GL_SCISSOR_TEST);

	// Do 10 random color clears
	for (int i = 0; i < 15; i++)
	{
		int		cX		= (int)(deRandom_getUint32(&rnd) & 0x7fffffff) % width;
		int		cY		= (int)(deRandom_getUint32(&rnd) & 0x7fffffff) % height;
		int		cWidth	= (int)(deRandom_getUint32(&rnd) & 0x7fffffff) % (width-cX);
		int		cHeight	= (int)(deRandom_getUint32(&rnd) & 0x7fffffff) % (height-cY);
		Vec4	color	= RGBA(deRandom_getUint32(&rnd)).toVec();

		context.scissor(cX, cY, cWidth, cHeight);
		context.clearColor(color.x(), color.y(), color.z(), color.w());
		context.clear(GL_COLOR_BUFFER_BIT);
	}

	// Disable scissor.
	context.disable(GL_SCISSOR_TEST);

	if (fbo.getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		// Unbind fbo
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);

		// Draw to screen
		SingleTex2DShader	shader;
		deUint32			shaderID = context.createProgram(&shader);

		shader.setUnit(context, shaderID, 0);

		context.bindTexture(GL_TEXTURE_2D, fbo.getColorbuffer());
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Read from screen
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
	{
		// Read from fbo
		context.readPixels(dst, 0, 0, width, height);
	}
}